

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_constraint_messages_tests.c
# Opt level: O1

void test_fit_piece(Constraint *constraint,char *function_name,CgreenValue actual,char *test_file,
                   int test_line,TestReporter *reporter)

{
  _func_void_TestReporter_ptr_char_ptr_int_int_char_ptr_varargs *p_Var1;
  _Bool _Var2;
  
  p_Var1 = reporter->assert_true;
  _Var2 = (*constraint->compare)(constraint,actual);
  (*p_Var1)(reporter,test_file,test_line,(uint)_Var2,
            "Piece [%f], does not fit in [%f] in function [%s] parameter [%s]",
            (ulong)(uint)(int)*(constraint->expected_value).value.string_value,
            (int)*actual.value.string_value,function_name,constraint->parameter_name);
  return;
}

Assistant:

static void test_fit_piece(Constraint *constraint, const char *function_name, CgreenValue actual,
                           const char *test_file, int test_line, TestReporter *reporter) {
    (*reporter->assert_true)(
            reporter,
            test_file,
            test_line,
            (*constraint->compare)(constraint, actual),
            "Piece [%f], does not fit in [%f] in function [%s] parameter [%s]",
            ((Piece *)constraint->expected_value.value.pointer_value)->id,
            ((Struct *)actual.value.pointer_value)->id,
            function_name,
            constraint->parameter_name);
}